

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O0

void __thiscall
CNetBase::SendControlMsg
          (CNetBase *this,NETADDR *pAddr,TOKEN Token,int Ack,int ControlMsg,void *pExtra,
          int ExtraSize)

{
  long lVar1;
  CNetPacketConstruct *in_RDI;
  undefined4 in_R8D;
  NETADDR *in_R9;
  long in_FS_OFFSET;
  int in_stack_00000008;
  CNetPacketConstruct Construct;
  void *in_stack_fffffffffffffa38;
  undefined4 in_stack_fffffffffffffa50;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (0 < in_stack_00000008) {
    mem_copy(in_RDI,in_stack_fffffffffffffa38,0);
  }
  SendPacket((CNetBase *)CONCAT44(in_R8D,in_stack_fffffffffffffa50),in_R9,in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CNetBase::SendControlMsg(const NETADDR *pAddr, TOKEN Token, int Ack, int ControlMsg, const void *pExtra, int ExtraSize)
{
	CNetPacketConstruct Construct;
	Construct.m_Token = Token;
	Construct.m_Flags = NET_PACKETFLAG_CONTROL;
	Construct.m_Ack = Ack;
	Construct.m_NumChunks = 0;
	Construct.m_DataSize = 1+ExtraSize;
	Construct.m_aChunkData[0] = ControlMsg;
	if(ExtraSize > 0)
		mem_copy(&Construct.m_aChunkData[1], pExtra, ExtraSize);

	// send the control message
	SendPacket(pAddr, &Construct);
}